

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O3

double __thiscall
TasGrid::GridLocalPolynomial::evalBasisSupported<(TasGrid::RuleLocal::erule)1>
          (GridLocalPolynomial *this,int *point,double *x,bool *isSupported)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)1>(this->order,*point,*x,isSupported);
  if (*isSupported == true) {
    if (1 < (this->super_BaseCanonicalGrid).num_dimensions) {
      lVar1 = 1;
      do {
        dVar3 = RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)1>
                          (this->order,point[lVar1],x[lVar1],isSupported);
        if (*isSupported != true) goto LAB_00180c6a;
        dVar2 = dVar2 * dVar3;
        lVar1 = lVar1 + 1;
      } while (lVar1 < (this->super_BaseCanonicalGrid).num_dimensions);
    }
  }
  else {
LAB_00180c6a:
    dVar2 = 0.0;
  }
  return dVar2;
}

Assistant:

double evalBasisSupported(const int point[], const double x[], bool &isSupported) const{
        double f = RuleLocal::evalSupport<eff_rule>(order, point[0], x[0], isSupported);
        if (!isSupported) return 0.0;
        for(int j=1; j<num_dimensions; j++){
            f *= RuleLocal::evalSupport<eff_rule>(order, point[j], x[j], isSupported);
            if (!isSupported) return 0.0;
        }
        return f;
    }